

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase646::run(TestCase646 *this)

{
  bool bVar1;
  TransformPromiseNodeBase *this_00;
  Promise<void> promise;
  WaitScope waitScope;
  Own<kj::_::PromiseNode> local_d0;
  Fault f;
  TaskSet tasks;
  Own<kj::_::PromiseNode> local_88;
  PromiseFulfillerPair<void> paf;
  ErrorHandlerImpl errorHandler;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  errorHandler.super_ErrorHandler._vptr_ErrorHandler = (_func_int **)&PTR_taskFailed_0041bba0;
  errorHandler.exceptionCount = 0;
  TaskSet::TaskSet(&tasks,&errorHandler.super_ErrorHandler);
  if ((tasks.tasks.ptr.ptr != (Task *)0x0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x28c,ERROR,"\"failed: expected \" \"tasks.isEmpty()\"",
               (char (*) [33])"failed: expected tasks.isEmpty()");
  }
  newPromiseAndFulfiller<void>();
  TaskSet::add(&tasks,&paf.promise);
  _::yield();
  this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_88,
             _::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:656:23),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041bea8;
  promise.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase646::run()::$_0,kj::_::PropagateException>>
        ::instance;
  f.exception = (Exception *)
                &_::
                 HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase646::run()::$_0,kj::_::PropagateException>>
                 ::instance;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  local_d0.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase646::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_d0.ptr = (PromiseNode *)this_00;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  Own<kj::_::PromiseNode>::dispose(&local_88);
  TaskSet::add(&tasks,(Promise<void> *)&local_d0);
  Own<kj::_::PromiseNode>::dispose(&local_d0);
  if ((tasks.tasks.ptr.ptr == (Task *)0x0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x292,ERROR,"\"failed: expected \" \"!tasks.isEmpty()\"",
               (char (*) [34])"failed: expected !tasks.isEmpty()");
  }
  TaskSet::onEmpty((TaskSet *)&promise);
  bVar1 = _::pollImpl(promise.super_PromiseBase.node.ptr,&waitScope);
  if (bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x295,ERROR,"\"failed: expected \" \"!promise.poll(waitScope)\"",
               (char (*) [42])"failed: expected !promise.poll(waitScope)");
  }
  if ((tasks.tasks.ptr.ptr == (Task *)0x0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x296,ERROR,"\"failed: expected \" \"!tasks.isEmpty()\"",
               (char (*) [34])"failed: expected !tasks.isEmpty()");
  }
  (**(paf.fulfiller.ptr)->_vptr_PromiseFulfiller)(paf.fulfiller.ptr,&f);
  bVar1 = _::pollImpl(promise.super_PromiseBase.node.ptr,&waitScope);
  if (bVar1) {
    if ((tasks.tasks.ptr.ptr != (Task *)0x0) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[33]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x29a,ERROR,"\"failed: expected \" \"tasks.isEmpty()\"",
                 (char (*) [33])"failed: expected tasks.isEmpty()");
    }
    Promise<void>::wait(&promise,&waitScope);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
    PromiseFulfillerPair<void>::~PromiseFulfillerPair(&paf);
    TaskSet::~TaskSet(&tasks);
    WaitScope::~WaitScope(&waitScope);
    EventLoop::~EventLoop(&loop);
    return;
  }
  _::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
             ,0x299,FAILED,"promise.poll(waitScope)","");
  _::Debug::Fault::fatal(&f);
}

Assistant:

TEST(Async, TaskSetOnEmpty) {
  EventLoop loop;
  WaitScope waitScope(loop);
  ErrorHandlerImpl errorHandler;
  TaskSet tasks(errorHandler);

  KJ_EXPECT(tasks.isEmpty());

  auto paf = newPromiseAndFulfiller<void>();
  tasks.add(kj::mv(paf.promise));
  tasks.add(evalLater([]() {}));

  KJ_EXPECT(!tasks.isEmpty());

  auto promise = tasks.onEmpty();
  KJ_EXPECT(!promise.poll(waitScope));
  KJ_EXPECT(!tasks.isEmpty());

  paf.fulfiller->fulfill();
  KJ_ASSERT(promise.poll(waitScope));
  KJ_EXPECT(tasks.isEmpty());
  promise.wait(waitScope);
}